

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPSender.hpp
# Opt level: O0

void __thiscall Statsd::UDPSender::flush(UDPSender *this)

{
  bool bVar1;
  reference message;
  undefined1 local_20 [8];
  unique_lock<std::mutex> batchingLock;
  UDPSender *this_local;
  
  batchingLock._8_8_ = this;
  bVar1 = std::thread::joinable(&this->m_batchingThread);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_20,&this->m_batchingMutex);
  }
  else {
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20);
  }
  while (bVar1 = std::
                 deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty(&this->m_batchingMessageQueue), ((bVar1 ^ 0xffU) & 1) != 0) {
    message = std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::front(&this->m_batchingMessageQueue);
    sendToDaemon(this,message);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&this->m_batchingMessageQueue);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

inline void UDPSender::flush() noexcept {
    // We aquire a lock but only if we actually need to (ie there is a thread also accessing the queue)
    auto batchingLock =
        m_batchingThread.joinable() ? std::unique_lock<std::mutex>(m_batchingMutex) : std::unique_lock<std::mutex>();
    // Flush the queue
    while (!m_batchingMessageQueue.empty()) {
        sendToDaemon(m_batchingMessageQueue.front());
        m_batchingMessageQueue.pop_front();
    }
}